

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifresearch(bifcxdef *ctx,int argc)

{
  uchar **ppuVar1;
  ushort uVar2;
  runsdef *prVar3;
  ushort *puVar4;
  ushort *puVar5;
  uint uVar6;
  runcxdef *prVar7;
  int32_t tmp_1;
  int32_t tmp_2;
  uint siz;
  uint16_t tmp;
  uint uVar8;
  int result_len;
  runsdef val;
  int local_3c;
  runsdef local_38;
  
  prVar3 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar3 + -1;
  prVar7 = ctx->bifcxrun;
  if (prVar3[-1].runstyp == '\x03') {
    prVar3 = prVar7->runcxsp;
    puVar4 = (ushort *)(prVar3->runsv).runsvstr;
    uVar2 = *puVar4;
    prVar7->runcxsp = prVar3 + -1;
    if (prVar3[-1].runstyp == '\x03') {
      puVar5 = (ushort *)(ctx->bifcxrun->runcxsp->runsv).runsvstr;
      uVar6 = re_compile_and_search
                        (&ctx->bifcxregex,(char *)(puVar4 + 1),(ulong)uVar2 - 2,(char *)(puVar5 + 1)
                         ,(ulong)*puVar5 - 2,&local_3c);
      if ((int)uVar6 < 0) {
        runpnil(ctx->bifcxrun);
      }
      else {
        uVar8 = local_3c + 0xf;
        prVar7 = ctx->bifcxrun;
        siz = uVar8 & 0xffff;
        if ((uint)(*(int *)&prVar7->runcxhtop - *(int *)&prVar7->runcxhp) <= siz) {
          runhcmp(prVar7,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
        }
        local_38.runstyp = '\a';
        local_38.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
        *(short *)local_38.runsv.runsvstr = (short)uVar8;
        *(uchar *)(local_38.runsv.runsvnum + 2) = '\x01';
        *(uint *)(local_38.runsv.runsvnum + 3) = uVar6 + 1;
        *(uchar *)(local_38.runsv.runsvnum + 7) = '\x01';
        *(int *)(local_38.runsv.runsvnum + 8) = local_3c;
        *(uchar *)(local_38.runsv.runsvnum + 0xc) = '\x03';
        *(short *)(local_38.runsv.runsvnum + 0xd) = (short)local_3c + 2;
        memcpy((uchar *)(local_38.runsv.runsvnum + 0xf),(ctx->bifcxregex).strbuf + uVar6,
               (long)local_3c);
        ppuVar1 = &ctx->bifcxrun->runcxhp;
        *ppuVar1 = *ppuVar1 + siz;
        runrepush(ctx->bifcxrun,&local_38);
      }
      return;
    }
    prVar7 = ctx->bifcxrun;
  }
  prVar7->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3ef);
}

Assistant:

void bifresearch(bifcxdef *ctx, int argc)
{
    uchar  *patstr;
    size_t  patlen;
    uchar  *searchstr;
    size_t  searchlen;
    int     result_len;
    int     match_ofs;
    
    /* this function takes two parameters: pattern, string */
    bifcntargs(ctx, 2, argc);

    /* get the pattern string */
    patstr = runpopstr(ctx->bifcxrun);
    patlen = osrp2(patstr) - 2;
    patstr += 2;

    /* get the search string */
    searchstr = runpopstr(ctx->bifcxrun);
    searchlen = osrp2(searchstr) - 2;
    searchstr += 2;

    /* search for the pattern in the string */
    match_ofs = re_compile_and_search(&ctx->bifcxregex,
                                      (char *)patstr, patlen,
                                      (char *)searchstr, searchlen,
                                      &result_len);

    /* 
     *   if we didn't match, return nil; otherwise, return a list with the
     *   match offset and length 
     */
    if (match_ofs < 0)
    {
        /* no match - return nil */
        runpnil(ctx->bifcxrun);
    }
    else
    {
        ushort listsiz;
        runsdef val;
        uchar *p;
        
        /* 
         *   build a list consisting of two numbers and a string: two
         *   bytes for the list header, then two elements at (one byte for
         *   the datatype header, four bytes for the number), then the
         *   string element with (one byte for the datatype, two bytes for
         *   the string length prefix, and the bytes of the string) 
         */
        listsiz = 2 + (1+4)*2 + (1 + 2 + (ushort)(result_len));

        /* allocate the space */
        runhres(ctx->bifcxrun, listsiz, 0);

        /* set up the list stack item */
        val.runstyp = DAT_LIST;
        p = val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

        /* set the list's length */
        oswp2(p, listsiz);
        p += 2;

        /* 
         *   Add the offset element.  For consistency with TADS
         *   conventions, use 1 as the offset of the first character in
         *   the string - this makes it easy to use the offset value with
         *   substr(). 
         */
        *p++ = DAT_NUMBER;
        oswp4s(p, match_ofs + 1);
        p += 4;

        /* add the length element */
        *p++ = DAT_NUMBER;
        oswp4s(p, result_len);
        p += 4;

        /* add the result string */
        *p++ = DAT_SSTRING;
        oswp2(p, result_len + 2);
        p += 2;
        memcpy(p, ctx->bifcxregex.strbuf + match_ofs, result_len);

        /* reserve the space in the heap */
        ctx->bifcxrun->runcxhp += listsiz;

        /* return the list */
        runrepush(ctx->bifcxrun, &val);
    }
}